

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  int iVar1;
  Parse *p;
  int *piVar2;
  uint uVar3;
  long in_RSI;
  Parse *in_RDI;
  int iBaseCol;
  int regSubtype;
  int j;
  int regAgg;
  int nKey;
  int nArg;
  int iTop;
  ExprList *pList;
  AggInfo_func *pF;
  int i;
  Vdbe *v;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Parse *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int iVar4;
  int local_3c;
  long *local_28;
  int local_1c;
  
  p = (Parse *)in_RDI->pVdbe;
  local_1c = 0;
  local_28 = *(long **)(in_RSI + 0x28);
  while ((local_1c < *(int *)(in_RSI + 0x30) && (in_RDI->nErr == 0))) {
    piVar2 = *(int **)(*local_28 + 0x20);
    if (-1 < (int)local_28[3]) {
      iVar1 = *piVar2;
      sqlite3GetTempRange((Parse *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      if (*(char *)((long)local_28 + 0x1c) == '\0') {
        local_3c = 0;
      }
      else {
        local_3c = **(int **)(*(long *)(*local_28 + 0x10) + 0x20);
        if (*(char *)((long)local_28 + 0x1d) == '\0') {
          local_3c = local_3c + 1;
        }
      }
      sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
      iVar4 = iVar1;
      while (iVar4 = iVar4 + -1, -1 < iVar4) {
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
      if (*(char *)((long)local_28 + 0x1e) != '\0') {
        in_stack_ffffffffffffffb8 = sqlite3GetTempReg(in_RDI);
        in_stack_ffffffffffffffac = local_3c + iVar1;
        uVar3 = in_stack_ffffffffffffffb0 & 0xffffff;
        if (*(char *)((long)local_28 + 0x1c) == '\0') {
          uVar3 = CONCAT13(*(char *)((long)local_28 + 0x1d) == '\0',(int3)in_stack_ffffffffffffffb0)
          ;
        }
        in_stack_ffffffffffffffb0 = uVar3;
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffac + (in_stack_ffffffffffffffb0 >> 0x18);
        iVar4 = iVar1;
        while (iVar4 = iVar4 + -1, -1 < iVar4) {
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                            in_stack_ffffffffffffff98,0);
        }
        sqlite3ReleaseTempReg(in_RDI,in_stack_ffffffffffffffb8);
      }
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb4,
                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                        in_stack_ffffffffffffffa8);
      sqlite3VdbeAppendP4((Vdbe *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      sqlite3VdbeChangeP5((Vdbe *)p,(u16)iVar1);
      sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98,0);
      sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      sqlite3ReleaseTempRange
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    }
    in_stack_ffffffffffffffa8 = *(int *)(in_RSI + 0xc) + *(int *)(in_RSI + 0x20) + local_1c;
    if (piVar2 == (int *)0x0) {
      in_stack_ffffffffffffff9c = 0;
    }
    else {
      in_stack_ffffffffffffff9c = *piVar2;
    }
    in_stack_ffffffffffffffa0 = p;
    sqlite3VdbeAddOp2((Vdbe *)p,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
    sqlite3VdbeAppendP4((Vdbe *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    local_1c = local_1c + 1;
    local_28 = local_28 + 4;
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    if( pParse->nErr ) return;
    pList = pF->pFExpr->x.pList;
    if( pF->iOBTab>=0 ){
      /* For an ORDER BY aggregate, calls to OP_AggStep were deferred.  Inputs
      ** were stored in emphermal table pF->iOBTab.  Here, we extract those
      ** inputs (in ORDER BY order) and make all calls to OP_AggStep
      ** before doing the OP_AggFinal call. */
      int iTop;        /* Start of loop for extracting columns */
      int nArg;        /* Number of columns to extract */
      int nKey;        /* Key columns to be skipped */
      int regAgg;      /* Extract into this array */
      int j;           /* Loop counter */

      assert( pF->pFunc!=0 );
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);

      if( pF->bOBPayload==0 ){
        nKey = 0;
      }else{
        assert( pF->pFExpr->pLeft!=0 );
        assert( ExprUseXList(pF->pFExpr->pLeft) );
        assert( pF->pFExpr->pLeft->x.pList!=0 );
        nKey = pF->pFExpr->pLeft->x.pList->nExpr;
        if( ALWAYS(!pF->bOBUnique) ) nKey++;
      }
      iTop = sqlite3VdbeAddOp1(v, OP_Rewind, pF->iOBTab); VdbeCoverage(v);
      for(j=nArg-1; j>=0; j--){
        sqlite3VdbeAddOp3(v, OP_Column, pF->iOBTab, nKey+j, regAgg+j);
      }
      if( pF->bUseSubtype ){
        int regSubtype = sqlite3GetTempReg(pParse);
        int iBaseCol = nKey + nArg + (pF->bOBPayload==0 && pF->bOBUnique==0);
        for(j=nArg-1; j>=0; j--){
          sqlite3VdbeAddOp3(v, OP_Column, pF->iOBTab, iBaseCol+j, regSubtype);
          sqlite3VdbeAddOp2(v, OP_SetSubtype, regSubtype, regAgg+j);
        }
        sqlite3ReleaseTempReg(pParse, regSubtype);
      }
      sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, AggInfoFuncReg(pAggInfo,i));
      sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      sqlite3VdbeAddOp2(v, OP_Next, pF->iOBTab, iTop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, iTop);
      sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    }
    sqlite3VdbeAddOp2(v, OP_AggFinal, AggInfoFuncReg(pAggInfo,i),
                      pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}